

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mythread.h
# Opt level: O0

void mythread_sigmask(int how,sigset_t *set,sigset_t *oset)

{
  int iVar1;
  int ret;
  sigset_t *oset_local;
  sigset_t *set_local;
  int how_local;
  
  iVar1 = pthread_sigmask(how,(__sigset_t *)set,(__sigset_t *)oset);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("ret == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                ,0x93,"void mythread_sigmask(int, const sigset_t *restrict, sigset_t *restrict)");
}

Assistant:

static inline void
mythread_sigmask(int how, const sigset_t *restrict set,
		sigset_t *restrict oset)
{
#ifdef __VMS
	(void)how;
	(void)set;
	(void)oset;
#else
	int ret = pthread_sigmask(how, set, oset);
	assert(ret == 0);
	(void)ret;
#endif
}